

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O2

void __thiscall
denialofservice_tests::OutboundTest::AddRandomOutboundPeer
          (OutboundTest *this,NodeId *id,vector<CNode_*,_std::allocator<CNode_*>_> *vNodes,
          PeerManager *peerLogic,ConnmanTestMsg *connman,ConnectionType connType,bool onion_peer)

{
  long lVar1;
  long idIn;
  CService ipIn;
  readonly_property65 rVar2;
  bool bVar3;
  uint64_t uVar4;
  CNode *pCVar5;
  ConnmanTestMsg *pCVar6;
  undefined4 in_register_0000008c;
  iterator pvVar7;
  string *addrNameIn;
  long in_FS_OFFSET;
  const_string file;
  Span<const_unsigned_char> addr_00;
  const_string msg;
  shared_ptr<Sock> sock;
  check_type cVar8;
  CNodeOptions *node_opts;
  _func_int **in_stack_fffffffffffffe78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_180 [2];
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  assertion_result local_150;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  undefined1 local_118 [8];
  __uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> local_110;
  undefined1 *local_108;
  char **local_100;
  undefined1 local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tor_addr;
  CService local_d0;
  CAddress local_a8;
  CAddress addr;
  
  pvVar7 = (iterator)CONCAT44(in_register_0000008c,connType);
  addrNameIn = (string *)(ulong)connType;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar6 = connman;
  CAddress::CAddress(&addr);
  if (onion_peer) {
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              (&tor_addr,
               &(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_rng.
                super_RandomMixin<FastRandomContext>,0x20);
    local_128 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_120 = "";
    local_138 = &boost::unit_test::basic_cstring<char_const>::null;
    local_130 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x74;
    file.m_begin = (iterator)&local_128;
    msg.m_end = pvVar7;
    msg.m_begin = (iterator)pCVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_138,msg);
    addr_00.m_size =
         (long)tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    addr_00.m_data =
         tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    OnionToString_abi_cxx11_((string *)&local_a8,addr_00);
    _cVar8 = 0x2fd831;
    rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)CNetAddr::SetSpecial((CNetAddr *)&addr,(string *)&local_a8);
    local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
    local_150.m_message.px = (element_type *)0x0;
    local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_100 = &local_160;
    local_160 = "addr.SetSpecial(OnionToString(tor_addr))";
    local_158 = "";
    local_110._M_t.
    super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
    super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
         (tuple<i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>)
         ((ulong)local_110._M_t.
                 super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                 .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl &
         0xffffffffffffff00);
    local_118 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
    local_108 = boost::unit_test::lazy_ostream::inst;
    local_170 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/denialofservice_tests.cpp"
    ;
    local_168 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_150,(lazy_ostream *)local_118,2,0,WARN,_cVar8,(size_t)&local_170,0x74);
    boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
    std::__cxx11::string::~string((string *)&local_a8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&tor_addr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  while( true ) {
    bVar3 = CNetAddr::IsRoutable((CNetAddr *)&addr);
    if (bVar3) break;
    uVar4 = RandomMixin<FastRandomContext>::randbits
                      (&(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                        m_rng.super_RandomMixin<FastRandomContext>,0x20);
    ip(&local_d0,(uint32_t)uVar4);
    ipIn.super_CNetAddr.m_addr._union._8_8_ = connman;
    ipIn.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)addrNameIn;
    ipIn.super_CNetAddr.m_addr._16_8_ = peerLogic;
    ipIn.super_CNetAddr._24_8_ = vNodes;
    ipIn._32_8_ = in_stack_fffffffffffffe78;
    CAddress::CAddress(&local_a8,ipIn,(ServiceFlags)&local_d0);
    CAddress::operator=(&addr,&local_a8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_a8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d0);
  }
  pCVar5 = (CNode *)operator_new(0x3a8);
  idIn = *id;
  *id = idIn + 1;
  a_Stack_180[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CAddress::CAddress(&local_a8);
  node_opts = (CNodeOptions *)0x2fd995;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tor_addr,"",(allocator<char> *)&local_160);
  local_118 = (undefined1  [8])((ulong)local_118 & 0xffffffff00000000);
  local_110._M_t.
  super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl =
       (tuple<i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>)
       (_Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>)0x0;
  local_108 = (undefined1 *)((ulong)local_108 & 0xffffffffffffff00);
  local_100 = (char **)0x4c4b40;
  local_f8 = 0;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&addr;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xfffffffffffffe78;
  CNode::CNode(pCVar5,idIn,sock,(CAddress *)0x0,0,(uint64_t)&local_a8,(CAddress *)&tor_addr,
               addrNameIn,INBOUND,SUB81(local_118,0),node_opts);
  local_150._0_8_ = pCVar5;
  std::vector<CNode*,std::allocator<CNode*>>::emplace_back<CNode*>
            ((vector<CNode*,std::allocator<CNode*>> *)vNodes,(CNode **)&local_150);
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)&local_110);
  std::__cxx11::string::~string((string *)&tor_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_180);
  pCVar5 = *(CNode **)(*(long *)((long)vNodes + 8) + -8);
  LOCK();
  (pCVar5->m_greatest_common_version).super___atomic_base<int>._M_i = 0x11180;
  UNLOCK();
  (**(peerLogic->super_NetEventsInterface)._vptr_NetEventsInterface)
            (&peerLogic->super_NetEventsInterface,pCVar5,9);
  LOCK();
  (pCVar5->fSuccessfullyConnected)._M_base._M_i = true;
  UNLOCK();
  ConnmanTestMsg::AddTestNode(connman,pCVar5);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddRandomOutboundPeer(NodeId& id, std::vector<CNode*>& vNodes, PeerManager& peerLogic, ConnmanTestMsg& connman, ConnectionType connType, bool onion_peer = false)
{
    CAddress addr;

    if (onion_peer) {
        auto tor_addr{m_rng.randbytes(ADDR_TORV3_SIZE)};
        BOOST_REQUIRE(addr.SetSpecial(OnionToString(tor_addr)));
    }

    while (!addr.IsRoutable()) {
        addr = CAddress(ip(m_rng.randbits(32)), NODE_NONE);
    }

    vNodes.emplace_back(new CNode{id++,
                                  /*sock=*/nullptr,
                                  addr,
                                  /*nKeyedNetGroupIn=*/0,
                                  /*nLocalHostNonceIn=*/0,
                                  CAddress(),
                                  /*addrNameIn=*/"",
                                  connType,
                                  /*inbound_onion=*/false});
    CNode &node = *vNodes.back();
    node.SetCommonVersion(PROTOCOL_VERSION);

    peerLogic.InitializeNode(node, ServiceFlags(NODE_NETWORK | NODE_WITNESS));
    node.fSuccessfullyConnected = true;

    connman.AddTestNode(node);
}